

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O3

void check_variant_empty<type_safe::basic_variant<type_safe::optional_variant_policy,int,evil_variant_test_type>>
               (basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type> *var)

{
  unsigned_long uVar1;
  AssertionHandler catchAssertionHandler;
  AssertionHandler local_120;
  SourceLineInfo local_d8;
  ITransientExpression local_c8;
  strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
  *local_b8;
  char *local_b0;
  size_t sStack_a8;
  type_id *local_a0;
  strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
  local_98;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_c8._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_c8.m_isBinaryExpression = true;
  local_c8.m_result = false;
  local_c8._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_d8.line = 0x1c;
  Catch::StringRef::StringRef(&local_40,"!var.has_value()");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_c8,&local_d8,local_40,Normal);
  local_c8._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_c8._vptr_ITransientExpression._1_7_,
                (var->storage_).storage_.cur_type_.
                super_strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
                .value_ == 0);
  Catch::AssertionHandler::handleExpr<bool>(&local_120,(ExprLhs<bool> *)&local_c8);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_c8._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_c8.m_isBinaryExpression = true;
  local_c8.m_result = false;
  local_c8._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_d8.line = 0x1d;
  Catch::StringRef::StringRef(&local_50,"!var");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_c8,&local_d8,local_50,Normal);
  local_c8._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_c8._vptr_ITransientExpression._1_7_,
                (var->storage_).storage_.cur_type_.
                super_strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
                .value_ == 0);
  Catch::AssertionHandler::handleExpr<bool>(&local_120,(ExprLhs<bool> *)&local_c8);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_c8._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_c8.m_isBinaryExpression = true;
  local_c8.m_result = false;
  local_c8._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_d8.line = 0x20;
  Catch::StringRef::StringRef(&local_60,"var.type() == Variant::invalid_type");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_c8,&local_d8,local_60,Normal);
  uVar1 = (var->storage_).storage_.cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
          .value_;
  local_98.value_ = uVar1;
  Catch::StringRef::StringRef((StringRef *)&local_d8,"==");
  local_c8.m_result = uVar1 == 0;
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00230bf0;
  local_b0 = local_d8.file;
  sStack_a8 = local_d8.line;
  local_a0 = &type_safe::
              basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>::
              invalid_type;
  local_b8 = &local_98;
  Catch::AssertionHandler::handleExpr(&local_120,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_c8._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_c8.m_isBinaryExpression = true;
  local_c8.m_result = false;
  local_c8._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_d8.line = 0x21;
  Catch::StringRef::StringRef(&local_70,"var.has_value(variant_type<nullvar_t>{})");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_c8,&local_d8,local_70,Normal);
  local_c8._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_c8._vptr_ITransientExpression._1_7_,
                (var->storage_).storage_.cur_type_.
                super_strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
                .value_ == 0);
  Catch::AssertionHandler::handleExpr<bool>(&local_120,(ExprLhs<bool> *)&local_c8);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_evil_variant_test_type>::value
            (var);
  local_c8._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_c8.m_isBinaryExpression = true;
  local_c8.m_result = false;
  local_c8._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_d8.line = 0x29;
  Catch::StringRef::StringRef(&local_80,"var.optional_value(variant_type<nullvar_t>{})");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_c8,&local_d8,local_80,Normal);
  local_d8.file = (char *)0x0;
  if ((var->storage_).storage_.cur_type_.
      super_strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
      .value_ == 0) {
    local_d8.file = "";
  }
  local_c8._vptr_ITransientExpression = (_func_int **)&local_d8;
  Catch::AssertionHandler::
  handleExpr<type_safe::basic_optional<type_safe::reference_optional_storage<type_safe::nullvar_t_const,false>>const&>
            (&local_120,
             (ExprLhs<const_type_safe::basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>_&>
              *)&local_c8);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_c8._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_c8.m_isBinaryExpression = true;
  local_c8.m_result = false;
  local_c8._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_d8.line = 0x2a;
  Catch::StringRef::StringRef(&local_90,"!var.optional_value(variant_type<int>{})");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_c8,&local_d8,local_90,Normal);
  uVar1 = (var->storage_).storage_.cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_evil_variant_test_type>::type_id,_unsigned_long>
          .value_;
  if (uVar1 == 1) {
    type_safe::tagged_union<int,_evil_variant_test_type>::check<int>
              ((tagged_union<int,_evil_variant_test_type> *)var);
  }
  local_c8._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_c8._vptr_ITransientExpression._1_7_,uVar1 != 1);
  Catch::AssertionHandler::handleExpr<bool>(&local_120,(ExprLhs<bool> *)&local_c8);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void check_variant_empty(const Variant& var)
{
    // boolean queries
    REQUIRE(!var.has_value());
    REQUIRE(!var);

    // type queries
    REQUIRE(var.type() == Variant::invalid_type);
    REQUIRE(var.has_value(variant_type<nullvar_t>{}));

    // value query
    // (check that it compiles and does not abort)
    nullvar_t null = var.value(variant_type<nullvar_t>{});
    (void)null;

    // optional_value queries
    REQUIRE(var.optional_value(variant_type<nullvar_t>{}));
    REQUIRE(!var.optional_value(variant_type<int>{}));
}